

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreCommands.cpp
# Opt level: O2

void __thiscall
HelpIRCCommand::trigger
          (HelpIRCCommand *this,IRC_Bot *source,string_view in_channel,string_view nick,
          string_view parameters)

{
  int iVar1;
  int iVar2;
  long lVar3;
  Channel *pCVar4;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  vector<IRCCommand_*,_std::allocator<IRCCommand_*>_> cmds;
  char *local_68;
  string local_58;
  
  pcVar7 = nick._M_str;
  sVar6 = nick._M_len;
  lVar3 = Jupiter::IRC::Client::getChannel(source,in_channel._M_len,in_channel._M_str);
  if (lVar3 != 0) {
    iVar1 = Jupiter::IRC::Client::getAccessLevel(source,lVar3,sVar6,pcVar7);
    if (parameters._M_len == 0) {
      for (uVar5 = 0; (int)uVar5 <= iVar1; uVar5 = uVar5 + 1) {
        IRC_Bot::getAccessCommands((Channel *)&cmds,(int)source);
        if (local_68 != _cmds) {
          IRC_Bot::getTriggers_abi_cxx11_((vector *)&command_split);
          string_printf_abi_cxx11_
                    (&local_58,"Access level %d commands: %.*s",(ulong)uVar5,
                     command_split.first._M_str,command_split.first._M_len);
          Jupiter::IRC::Client::sendNotice
                    (source,sVar6,pcVar7,local_58._M_string_length,local_58._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&command_split);
        }
        std::_Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_>::~_Vector_base
                  ((_Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_> *)&cmds);
      }
      auVar8._8_8_ = "For command-specific help, use: help <command>";
      auVar8._0_8_ = 0x2e;
    }
    else {
      local_58._M_dataplus._M_p = (pointer)parameters._M_len;
      local_58._M_string_length = (size_type)parameters._M_str;
      _cmds = (char *)0x2;
      jessilib::
      word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                (&command_split,(basic_string_view<char,_std::char_traits<char>_> *)&local_58,
                 (basic_string_view<char,_std::char_traits<char>_> *)&cmds);
      pCVar4 = (Channel *)
               IRC_Bot::getCommand(source,command_split.first._M_len,command_split.first._M_str);
      if (pCVar4 == (Channel *)0x0) {
        auVar8._8_8_ = "Error: Command not found.";
        auVar8._0_8_ = 0x19;
      }
      else {
        iVar2 = IRCCommand::getAccessLevel(pCVar4);
        if (iVar2 < 0) {
          auVar8._8_8_ = "Error: Command disabled.";
          auVar8._0_8_ = 0x18;
        }
        else if (iVar1 < iVar2) {
          auVar8._8_8_ = "Access Denied.";
          auVar8._0_8_ = 0xe;
        }
        else {
          auVar8 = (*(code *)**(undefined8 **)pCVar4)
                             (pCVar4,command_split.second._M_len,command_split.second._M_str);
        }
      }
    }
    Jupiter::IRC::Client::sendNotice(source,sVar6,pcVar7,auVar8._0_8_,auVar8._8_8_);
  }
  return;
}

Assistant:

void HelpIRCCommand::trigger(IRC_Bot *source, std::string_view in_channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *channel = source->getChannel(in_channel);
	if (channel != nullptr)
	{
		int access = source->getAccessLevel(*channel, nick);
		if (parameters.empty()) {
			for (int i = 0; i <= access; i++) {
				auto cmds = source->getAccessCommands(channel, i);
				if (cmds.size() != 0) {
					std::string triggers = source->getTriggers(cmds);
					if (triggers.size() >= 0) {
						source->sendNotice(nick, string_printf("Access level %d commands: %.*s", i, triggers.size(),
							triggers.data()));
					}
				}
			}
			source->sendNotice(nick, "For command-specific help, use: help <command>"sv);
		}
		else {
			auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
			IRCCommand *cmd = source->getCommand(command_split.first);
			if (cmd) {
				int command_access = cmd->getAccessLevel(channel);

				if (command_access < 0)
					source->sendNotice(nick, "Error: Command disabled."sv);
				else if (access < command_access)
					source->sendNotice(nick, "Access Denied."sv);
				else
					source->sendNotice(nick, cmd->getHelp(command_split.second));
			}
			else source->sendNotice(nick, "Error: Command not found."sv);
		}
	}
}